

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O3

void sg_init_buffer(sg_buffer buf_id,sg_buffer_desc *desc)

{
  undefined4 uVar1;
  _sg_buffer_t *buf;
  long lVar2;
  sg_buffer_desc *psVar3;
  sg_usage sVar4;
  sg_buffer_desc def;
  sg_buffer_desc local_70;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3df6,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
  }
  psVar3 = &local_70;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *(undefined4 *)&desc->field_0x4;
    psVar3->_start_canary = desc->_start_canary;
    *(undefined4 *)&psVar3->field_0x4 = uVar1;
    desc = (sg_buffer_desc *)&desc->size;
    psVar3 = (sg_buffer_desc *)&psVar3->size;
  }
  sVar4 = local_70.usage;
  local_70.type = local_70.type + (uint)(local_70.type == _SG_BUFFERTYPE_DEFAULT);
  local_70.usage = sVar4 + (sVar4 == _SG_USAGE_DEFAULT);
  if (local_70.size == 0) {
    local_70.size = local_70.data.size;
  }
  else if (local_70.data.size == 0) {
    local_70.data.size = local_70.size;
  }
  if (buf_id.id != 0) {
    buf = _sg_buffer_at((_sg_pools_t *)(ulong)buf_id.id,(uint32_t)desc);
    if ((buf->slot).id == buf_id.id) {
      if ((buf->slot).state != SG_RESOURCESTATE_ALLOC) {
        if (_sg.desc.logger.log_cb != (_func_void_char_ptr_void_ptr *)0x0) {
          (*_sg.desc.logger.log_cb)
                    ("sg_init_buffer: buffer must be in alloc state\n",_sg.desc.logger.user_data);
          return;
        }
        puts("sg_init_buffer: buffer must be in alloc state\n");
        return;
      }
      _sg_init_buffer(buf,&local_70);
      if (((buf->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
        __assert_fail("(buf->slot.state == SG_RESOURCESTATE_VALID) || (buf->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                      ,0x3dfc,"void sg_init_buffer(sg_buffer, const sg_buffer_desc *)");
      }
    }
  }
  return;
}

Assistant:

inline void sg_init_buffer(sg_buffer buf_id, const sg_buffer_desc& desc) { return sg_init_buffer(buf_id, &desc); }